

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O2

void __thiscall TinyGC::SetGCPhase(TinyGC *this,GCPhase gc_phase)

{
  uint __line;
  char *__assertion;
  
  if (gc_phase == kSweeping) {
    if (this->gc_phase_ == kMarking) goto LAB_0010263b;
    __assertion = "gc_phase_ == GCPhase::kMarking";
    __line = 0x52;
  }
  else if (gc_phase == kMarking) {
    if (this->gc_phase_ == kNone) goto LAB_0010263b;
    __assertion = "gc_phase_ == GCPhase::kNone";
    __line = 0x4f;
  }
  else {
    if ((gc_phase != kNone) || (this->gc_phase_ == kSweeping)) {
LAB_0010263b:
      this->gc_phase_ = gc_phase;
      return;
    }
    __assertion = "gc_phase_ == GCPhase::kSweeping";
    __line = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/v4kst1z[P]TinyGC/TinyGC.cpp"
                ,__line,"void TinyGC::SetGCPhase(GCPhase)");
}

Assistant:

void TinyGC::SetGCPhase(GCPhase gc_phase) {
  switch (gc_phase) {
    case GCPhase::kNone:
      assert(gc_phase_ == GCPhase::kSweeping);
      break;
    case GCPhase::kMarking:
      assert(gc_phase_ == GCPhase::kNone);
      break;
    case GCPhase::kSweeping:
      assert(gc_phase_ == GCPhase::kMarking);
      break;
  }
  gc_phase_ = gc_phase;
}